

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::MemoryModuleField::~MemoryModuleField(MemoryModuleField *this)

{
  ~MemoryModuleField(this);
  operator_delete(this);
  return;
}

Assistant:

explicit MemoryModuleField(const Location& loc = Location(),
                             string_view name = string_view())
      : ModuleFieldMixin<ModuleFieldType::Memory>(loc), memory(name) {}